

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Worker.cpp
# Opt level: O0

void __thiscall adios2::query::Worker::~Worker(Worker *this)

{
  Worker *in_RDI;
  
  ~Worker(in_RDI);
  operator_delete(in_RDI);
  return;
}

Assistant:

Worker::~Worker()
{
    if (m_Query != nullptr)
        delete m_Query;
}